

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O3

uint8_t * dtl_json_reader_lstrip(dtl_json_reader_t *self,uint8_t *pBegin,uint8_t *pEnd)

{
  uint8_t uVar1;
  int iVar2;
  uint8_t *puVar3;
  
  puVar3 = pBegin;
  if (pBegin < pEnd) {
    do {
      uVar1 = *puVar3;
      iVar2 = bstr_pred_is_whitespace(uVar1);
      if (iVar2 == 0) {
        return puVar3;
      }
      if (uVar1 == '\n') {
        self->lineNumber = self->lineNumber + 1;
      }
      puVar3 = puVar3 + 1;
      pBegin = pEnd;
    } while (puVar3 != pEnd);
  }
  return pBegin;
}

Assistant:

static const uint8_t *dtl_json_reader_lstrip(dtl_json_reader_t *self, const uint8_t *pBegin, const uint8_t *pEnd)
{
   const uint8_t *pNext = pBegin;
   while (pNext < pEnd)
   {
      int c = (int) *pNext;
      if (!bstr_pred_is_whitespace(c)){
         break;
      }
      if (c == '\n')
      {
         self->lineNumber++;
      }
      pNext++;
   }
   return pNext;
}